

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRngVErrMemory(xmlRelaxNGValidCtxtPtr ctxt,char *extra)

{
  void *local_30;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  char *extra_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  local_30 = (void *)0x0;
  if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    if (ctxt->serror == (xmlStructuredErrorFunc)0x0) {
      data = ctxt->error;
    }
    else {
      channel = (xmlGenericErrorFunc)ctxt->serror;
    }
    local_30 = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  if (extra == (char *)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,local_30,(void *)0x0,
                    (void *)0x0,0x13,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"Memory allocation failed\n");
  }
  else {
    __xmlRaiseError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,local_30,(void *)0x0,
                    (void *)0x0,0x13,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0
                    ,"Memory allocation failed : %s\n",extra);
  }
  return;
}

Assistant:

static void
xmlRngVErrMemory(xmlRelaxNGValidCtxtPtr ctxt, const char *extra)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }
    if (extra)
        __xmlRaiseError(schannel, channel, data,
                        NULL, NULL, XML_FROM_RELAXNGV,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, extra,
                        NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(schannel, channel, data,
                        NULL, NULL, XML_FROM_RELAXNGV,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, NULL,
                        NULL, NULL, 0, 0, "Memory allocation failed\n");
}